

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ai_map.cxx
# Opt level: O3

void __thiscall xray_re::xr_scene_ai_map::save(xr_scene_ai_map *this,xr_writer *w)

{
  pointer pbVar1;
  long lVar2;
  ai_node_le *node;
  pointer value;
  float local_2c;
  
  xr_scene_revision::save(&(this->super_xr_scene_part).m_revision,w);
  xr_writer::w_raw_chunk(w,1,&AIMAP_VERSION,2,false);
  xr_writer::w_raw_chunk(w,2,&this->m_flags,4,false);
  xr_writer::w_raw_chunk(w,3,&this->m_bbox,0x18,false);
  xr_writer::open_chunk(w,4);
  local_2c = this->m_cell_size;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  local_2c = this->m_factor_y;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  local_2c = this->m_can_up;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  local_2c = this->m_can_down;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,6);
  local_2c = (float)this->m_num_nodes;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  if ((ulong)this->m_num_nodes != 0) {
    node = this->m_nodes;
    lVar2 = (ulong)this->m_num_nodes * 0x1c;
    do {
      write_node_le::operator()((write_node_le *)&local_2c,node,w);
      node = node + 1;
      lVar2 = lVar2 + -0x1c;
    } while (lVar2 != 0);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,8);
  local_2c = this->m_visible_radius;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  local_2c = (float)this->m_brush_size;
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  xr_writer::close_chunk(w);
  xr_writer::w_raw_chunk(w,9,&this->m_smooth_height,4,false);
  xr_writer::open_chunk(w,7);
  local_2c = (float)((ulong)((long)(this->m_snap_objects).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_snap_objects).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  (*w->_vptr_xr_writer[2])(w,&local_2c,4);
  pbVar1 = (this->m_snap_objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (this->m_snap_objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
    xr_writer::w_sz(w,value);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_ai_map::save(xr_writer& w) const
{
	revision().save(w);

	w.w_chunk(AIMAP_CHUNK_VERSION, AIMAP_VERSION);
	w.w_chunk(AIMAP_CHUNK_FLAGS, m_flags);
	w.w_chunk(AIMAP_CHUNK_BOX, m_bbox);

	w.open_chunk(AIMAP_CHUNK_PARAMS);
	w.w_float(m_cell_size);
	w.w_float(m_factor_y);
	w.w_float(m_can_up);
	w.w_float(m_can_down);
	w.close_chunk();

	w.open_chunk(AIMAP_CHUNK_NODES);
	w.w_u32(m_num_nodes);
	w.w_cseq(m_num_nodes, m_nodes, write_node_le());
	w.close_chunk();

	w.open_chunk(AIMAP_CHUNK_PREFS);
	w.w_float(m_visible_radius);
	w.w_u32(m_brush_size);
	w.close_chunk();

	w.w_chunk<float>(AIMAP_CHUNK_SMOOTH_HEIGHT, m_smooth_height);

	w.open_chunk(AIMAP_CHUNK_SNAP_OBJECTS);
	w.w_size_u32(m_snap_objects.size());
	w.w_seq(m_snap_objects, xr_writer::f_w_sz());
	w.close_chunk();
}